

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O1

clock_t Integer::times(tms *__buffer)

{
  long lVar1;
  Data *this;
  long lVar2;
  _func_int **pp_Var3;
  long lVar4;
  long lVar5;
  
  this = (Data *)operator_new(0x18);
  Data::Data(this);
  this->_vptr_Data = (_func_int **)&PTR__Integer_00109d28;
  this[1]._vptr_Data = (_func_int **)0x1;
  lVar1 = __buffer->tms_utime;
  lVar4 = __buffer->tms_stime - lVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    pp_Var3 = this[1]._vptr_Data;
    lVar5 = 0;
    do {
      lVar2 = __dynamic_cast(*(undefined8 *)(lVar1 + lVar5 * 8),&Data::typeinfo,&typeinfo,0);
      pp_Var3 = (_func_int **)((long)pp_Var3 * *(long *)(lVar2 + 0x10));
      this[1]._vptr_Data = pp_Var3;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return (clock_t)this;
}

Assistant:

Data *Integer::times(std::vector<Data *> *dataPara) {
    auto result = new Integer(1);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value *= (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}